

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
          (basic_appender<char> out,write_int_arg<unsigned___int128> arg,format_specs *specs)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  presentation_type pVar1;
  bool bVar2;
  basic_appender<char> bVar3;
  format_specs *specs_00;
  basic_specs *in_RSI;
  buffer<char> *in_RDI;
  basic_appender<char> in_stack_00000008;
  anon_class_24_4_0fb5e8cf *in_stack_00000010;
  uint in_stack_00000018;
  uint padding;
  size_padding sp;
  uint p;
  basic_appender<char> it;
  int num_digits;
  long num_digits_1;
  uint prefix;
  unsigned___int128 abs_value;
  char *end;
  char *begin;
  char buffer [128];
  int buffer_size;
  undefined4 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddc;
  char in_stack_fffffffffffffddd;
  undefined1 in_stack_fffffffffffffdde;
  char in_stack_fffffffffffffddf;
  anon_class_24_4_0fb5e8cf *in_stack_fffffffffffffde0;
  basic_appender<char> in_stack_fffffffffffffde8;
  int size;
  buffer<char> *pbVar4;
  buffer<char> *out_00;
  basic_appender<char> local_158;
  uint local_14c;
  buffer<char> *local_148;
  basic_appender<char> local_140;
  int local_134;
  buffer<char> *local_130;
  buffer<char> *local_128;
  anon_class_24_4_0fb5e8cf *local_120;
  long local_110;
  buffer<char> *local_108;
  anon_class_24_4_0fb5e8cf *local_100;
  buffer<char> *local_e8;
  anon_class_24_4_0fb5e8cf *local_e0;
  bool local_cd;
  uint local_cc;
  buffer<char> *local_c8;
  anon_class_24_4_0fb5e8cf *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 local_a8 [128];
  undefined1 local_28 [12];
  undefined4 local_1c;
  basic_specs *local_18;
  basic_appender<char> local_10;
  buffer<char> *local_8;
  
  local_1c = 0x80;
  local_b0 = (char *)0x0;
  local_b8 = local_28;
  local_c0 = in_stack_00000010;
  local_c8 = in_stack_00000008.container;
  local_cc = in_stack_00000018;
  pbVar4 = in_RDI;
  out_00 = in_stack_00000008.container;
  local_18 = in_RSI;
  local_10.container = in_RDI;
  pVar1 = basic_specs::type(in_RSI);
  size = (int)((ulong)in_RDI >> 0x20);
  specs_00 = (format_specs *)(ulong)pVar1;
  switch(specs_00) {
  default:
    local_cd = false;
    ignore_unused<bool,char[1]>(&local_cd,(char (*) [1])0x791804);
  case (format_specs *)0x0:
  case (format_specs *)0x3:
    local_e0 = local_c0;
    local_e8 = local_c8;
    value_02._8_8_ = pbVar4;
    value_02._0_8_ = in_RSI;
    local_b0 = do_format_decimal<char,unsigned__int128>
                         ((char *)out_00,(unsigned___int128)value_02,size);
    break;
  case (format_specs *)0x4:
    basic_specs::upper(local_18);
    value[4] = in_stack_fffffffffffffddc;
    value._0_4_ = in_stack_fffffffffffffdd8;
    value[5] = in_stack_fffffffffffffddd;
    value[6] = in_stack_fffffffffffffdde;
    value[7] = in_stack_fffffffffffffddf;
    value._8_8_ = local_c0;
    local_b0 = do_format_base2e<char,unsigned__int128>
                         ((detail *)0x4,(int)local_a8,(char *)local_c8,(unsigned___int128)value,
                          (int)local_c0,true);
    bVar2 = basic_specs::alt(local_18);
    in_stack_fffffffffffffde0 = local_c0;
    in_stack_fffffffffffffde8.container = local_c8;
    if (bVar2) {
      bVar2 = basic_specs::upper(local_18);
      in_stack_fffffffffffffdde = 0x78;
      in_stack_fffffffffffffddf = 'X';
      if (!bVar2) {
        in_stack_fffffffffffffddf = 'x';
      }
      prefix_append(&local_cc,(int)in_stack_fffffffffffffddf << 8 | 0x30);
      in_stack_fffffffffffffde0 = local_c0;
      in_stack_fffffffffffffde8.container = local_c8;
    }
    break;
  case (format_specs *)0x5:
    local_100 = local_c0;
    local_108 = local_c8;
    value_00[4] = in_stack_fffffffffffffddc;
    value_00._0_4_ = in_stack_fffffffffffffdd8;
    value_00[5] = in_stack_fffffffffffffddd;
    value_00[6] = in_stack_fffffffffffffdde;
    value_00[7] = in_stack_fffffffffffffddf;
    value_00._8_8_ = in_stack_fffffffffffffde0;
    local_b0 = do_format_base2e<char,unsigned__int128>
                         ((detail *)0x3,(int)local_a8,(char *)local_c8,(unsigned___int128)value_00,
                          (int)local_c0,true);
    local_110 = (long)local_b8 - (long)local_b0;
    bVar2 = basic_specs::alt(local_18);
    if (((bVar2) && (*(int *)local_18[1].fill_data_ <= local_110)) &&
       (local_c8 != (buffer<char> *)0x0 || local_c0 != (anon_class_24_4_0fb5e8cf *)0x0)) {
      prefix_append(&local_cc,0x30);
    }
    break;
  case (format_specs *)0x6:
    local_120 = local_c0;
    local_128 = local_c8;
    value_01[4] = in_stack_fffffffffffffddc;
    value_01._0_4_ = in_stack_fffffffffffffdd8;
    value_01[5] = in_stack_fffffffffffffddd;
    value_01[6] = in_stack_fffffffffffffdde;
    value_01[7] = in_stack_fffffffffffffddf;
    value_01._8_8_ = in_stack_fffffffffffffde0;
    local_b0 = do_format_base2e<char,unsigned__int128>
                         ((detail *)0x1,(int)local_a8,(char *)local_c8,(unsigned___int128)value_01,
                          (int)local_c0,true);
    bVar2 = basic_specs::alt(local_18);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_18);
      in_stack_fffffffffffffddc = 0x62;
      in_stack_fffffffffffffddd = 'B';
      if (!bVar2) {
        in_stack_fffffffffffffddd = 'b';
      }
      prefix_append(&local_cc,(int)in_stack_fffffffffffffddd << 8 | 0x30);
    }
    break;
  case (format_specs *)0x7:
    local_130 = local_10.container;
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>
                      (in_stack_00000008,'\0',in_stack_fffffffffffffde8.container);
    return (basic_appender<char>)bVar3.container;
  }
  local_134 = (int)local_b8 - (int)local_b0;
  if (local_18[1].data_ == 0 && *(int *)local_18[1].fill_data_ == -1) {
    local_148 = local_10.container;
    to_unsigned<int>(0);
    local_140 = reserve<char>(in_stack_00000008,(size_t)specs_00);
    for (local_14c = local_cc & 0xffffff; local_14c != 0; local_14c = local_14c >> 8) {
      in_stack_fffffffffffffdd8 = CONCAT13((char)local_14c,(int3)in_stack_fffffffffffffdd8);
      local_158 = basic_appender<char>::operator++(&local_140,0);
      basic_appender<char>::operator*(&local_158);
      basic_appender<char>::operator=
                ((basic_appender<char> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddf);
    }
    bVar3 = copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                      ((char *)in_stack_fffffffffffffde0,
                       (char *)CONCAT17(in_stack_fffffffffffffddf,
                                        CONCAT16(in_stack_fffffffffffffdde,
                                                 CONCAT15(in_stack_fffffffffffffddd,
                                                          CONCAT14(in_stack_fffffffffffffddc,
                                                                   in_stack_fffffffffffffdd8)))),
                       in_stack_fffffffffffffde8);
    local_8 = (buffer<char> *)base_iterator<fmt::v11::basic_appender<char>>(local_10,bVar3);
  }
  else {
    size_padding::size_padding
              ((size_padding *)in_stack_00000010,(int)((ulong)in_stack_00000008.container >> 0x20),
               (uint)in_stack_00000008.container,specs_00);
    local_8 = (buffer<char> *)
              write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned__int128>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned__int128>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                        (in_stack_00000008,specs_00,in_stack_fffffffffffffde8.container,
                         in_stack_fffffffffffffde0);
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}